

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O0

void __thiscall
foxxll::linuxaio_queue::linuxaio_queue(linuxaio_queue *this,int desired_queue_length)

{
  bool bVar1;
  long lVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  io_error *this_00;
  Logger *pLVar6;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler;
  Logger local_350;
  LoggerVoidify local_1d2;
  undefined1 local_1d1;
  string local_1d0;
  ostringstream local_1b0 [8];
  ostringstream msg;
  long result;
  value_type local_28 [5];
  int local_14;
  linuxaio_queue *plStack_10;
  int desired_queue_length_local;
  linuxaio_queue *this_local;
  
  local_14 = desired_queue_length;
  plStack_10 = this;
  request_queue_impl_worker::request_queue_impl_worker(&this->super_request_queue_impl_worker);
  (this->super_request_queue_impl_worker).super_request_queue._vptr_request_queue =
       (_func_int **)&PTR_add_request_001e5f70;
  std::mutex::mutex(&this->waiting_mtx_);
  std::__cxx11::
  list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  ::list(&this->waiting_requests_);
  tlx::Semaphore::Semaphore(&this->num_waiting_requests_,0);
  tlx::Semaphore::Semaphore(&this->num_free_events_,0);
  tlx::Semaphore::Semaphore(&this->num_posted_requests_,0);
  std::thread::thread(&this->post_thread_);
  std::thread::thread(&this->wait_thread_);
  local_28[0] = NOT_RUNNING;
  shared_state<foxxll::request_queue_impl_worker::thread_state>::shared_state
            (&this->post_thread_state_,local_28);
  result._4_4_ = 0;
  shared_state<foxxll::request_queue_impl_worker::thread_state>::shared_state
            (&this->wait_thread_state_,(value_type *)((long)&result + 4));
  if (local_14 == 0) {
    this->max_events_ = 0x40;
  }
  else {
    this->max_events_ = local_14;
  }
  this->context_ = 0;
  while( true ) {
    lVar2 = syscall(0xce,(ulong)(uint)this->max_events_,&this->context_);
    bVar1 = false;
    __handler = extraout_RDX;
    if (lVar2 == -1) {
      piVar3 = __errno_location();
      bVar1 = false;
      __handler = extraout_RDX_00;
      if (*piVar3 == 0xb) {
        bVar1 = 1 < this->max_events_;
      }
    }
    if (!bVar1) break;
    this->max_events_ = this->max_events_ << 1;
  }
  if (lVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = std::operator<<((ostream *)local_1b0,"Error in ");
    poVar4 = std::operator<<(poVar4,"foxxll::linuxaio_queue::linuxaio_queue(int)");
    poVar4 = std::operator<<(poVar4," : ");
    poVar4 = std::operator<<(poVar4,"linuxaio_queue::linuxaio_queue io_setup() nr_events=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->max_events_);
    poVar4 = std::operator<<(poVar4," : ");
    piVar3 = __errno_location();
    pcVar5 = strerror(*piVar3);
    std::operator<<(poVar4,pcVar5);
    local_1d1 = 1;
    this_00 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(this_00,&local_1d0);
    local_1d1 = 0;
    __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
  }
  tlx::Semaphore::signal(&this->num_free_events_,this->max_events_,__handler);
  tlx::Logger::Logger(&local_350);
  pLVar6 = tlx::Logger::operator<<(&local_350,(char (*) [31])"Set up an linuxaio queue with ");
  pLVar6 = tlx::Logger::operator<<(pLVar6,&this->max_events_);
  pLVar6 = tlx::Logger::operator<<(pLVar6,(char (*) [10])" entries.");
  tlx::LoggerVoidify::operator&(&local_1d2,pLVar6);
  tlx::Logger::~Logger(&local_350);
  request_queue_impl_worker::start_thread
            (&this->super_request_queue_impl_worker,post_async,this,&this->post_thread_,
             &this->post_thread_state_);
  request_queue_impl_worker::start_thread
            (&this->super_request_queue_impl_worker,wait_async,this,&this->wait_thread_,
             &this->wait_thread_state_);
  return;
}

Assistant:

linuxaio_queue::linuxaio_queue(int desired_queue_length)
    : num_waiting_requests_(0), num_free_events_(0), num_posted_requests_(0),
      post_thread_state_(NOT_RUNNING), wait_thread_state_(NOT_RUNNING)
{
    if (desired_queue_length == 0) {
        // default value, 64 entries per queue (i.e. usually per disk) should
        // be enough
        max_events_ = 64;
    }
    else
        max_events_ = desired_queue_length;

    // negotiate maximum number of simultaneous events with the OS
    context_ = 0;
    long result;
    while ((result = syscall(SYS_io_setup, max_events_, &context_)) == -1 &&
           errno == EAGAIN && max_events_ > 1)
    {
        max_events_ <<= 1;               // try with half as many events
    }
    if (result != 0) {
        FOXXLL_THROW_ERRNO(
            io_error, "linuxaio_queue::linuxaio_queue"
            " io_setup() nr_events=" << max_events_
        );
    }

    num_free_events_.signal(max_events_);

    TLX_LOG1 << "Set up an linuxaio queue with " << max_events_ << " entries.";

    start_thread(post_async, static_cast<void*>(this), post_thread_, post_thread_state_);
    start_thread(wait_async, static_cast<void*>(this), wait_thread_, wait_thread_state_);
}